

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void Service_Browse_single
               (UA_Server *server,UA_Session *session,ContinuationPointEntry *cp,
               UA_BrowseDescription *descr,UA_UInt32 maxrefs,UA_BrowseResult *result)

{
  UA_NodeStore *ns;
  UA_ReferenceDescription *pUVar1;
  ContinuationPointEntry *pCVar2;
  size_t sVar3;
  UA_Boolean UVar4;
  UA_StatusCode UVar5;
  UA_StatusCode UVar6;
  uint uVar7;
  UA_NodeStoreEntry **ppUVar8;
  UA_ReferenceDescription *pUVar9;
  ContinuationPointEntry *pCVar10;
  UA_Guid *pUVar11;
  long lVar12;
  UA_BrowseDescription *pUVar13;
  UA_Node *pUVar14;
  ulong uVar15;
  ulong __nmemb;
  UA_Node *src;
  UA_NodeId *pUVar16;
  ulong uVar17;
  size_t sVar18;
  bool bVar19;
  UA_Guid UVar20;
  ulong local_90;
  size_t local_78;
  size_t relevant_refs_size;
  UA_NodeId *relevant_refs;
  ulong local_60;
  UA_ReferenceNode *local_58;
  size_t local_50;
  uint local_44;
  UA_BrowseDescription *local_40;
  char local_31;
  
  if (cp == (ContinuationPointEntry *)0x0) {
    local_90 = 0;
  }
  else {
    descr = &cp->browseDescription;
    local_90 = (ulong)cp->continuationIndex;
    maxrefs = cp->maxReferences;
  }
  if (UA_BROWSEDIRECTION_BOTH < descr->browseDirection) {
    result->statusCode = 0x804d0000;
    return;
  }
  local_78 = 0;
  relevant_refs_size = 0;
  pUVar16 = &descr->referenceTypeId;
  relevant_refs._4_4_ = maxrefs;
  local_40 = descr;
  local_31 = UA_NodeId_isNull(pUVar16);
  if (!(bool)local_31) {
    ns = server->nodestore;
    ppUVar8 = findNode(ns,pUVar16);
    if (ppUVar8 == (UA_NodeStoreEntry **)0x0) {
      pUVar14 = (UA_Node *)0x0;
    }
    else {
      pUVar14 = &(*ppUVar8)->node;
    }
    if ((pUVar14 == (UA_Node *)0x0) || (pUVar14->nodeClass != UA_NODECLASS_REFERENCETYPE)) {
      result->statusCode = 0x804c0000;
      return;
    }
    if (local_40->includeSubtypes == true) {
      UVar5 = getTypeHierarchy(ns,pUVar14,false,(UA_NodeId **)&relevant_refs_size,&local_78);
      result->statusCode = UVar5;
      if (UVar5 != 0) {
        return;
      }
    }
    else {
      local_78 = 1;
      relevant_refs_size = (size_t)pUVar16;
    }
  }
  pUVar13 = local_40;
  ppUVar8 = findNode(server->nodestore,&local_40->nodeId);
  if (ppUVar8 == (UA_NodeStoreEntry **)0x0) {
    pUVar14 = (UA_Node *)0x0;
  }
  else {
    pUVar14 = &(*ppUVar8)->node;
  }
  if (pUVar14 == (UA_Node *)0x0) {
    result->statusCode = 0x80340000;
LAB_00122814:
    if ((local_31 == '\0') && (local_40->includeSubtypes == true)) {
      UA_Array_delete((void *)relevant_refs_size,local_78,UA_TYPES + 0x10);
    }
    return;
  }
  uVar17 = pUVar14->referencesSize;
  if (uVar17 == 0) {
    result->referencesSize = 0;
    goto LAB_00122814;
  }
  uVar15 = (ulong)relevant_refs._4_4_;
  __nmemb = uVar15;
  if (uVar17 < uVar15) {
    __nmemb = uVar17;
  }
  if (relevant_refs._4_4_ == 0) {
    __nmemb = uVar17;
  }
  if (__nmemb == 0) {
    pUVar9 = (UA_ReferenceDescription *)0x1;
  }
  else {
    pUVar9 = (UA_ReferenceDescription *)calloc(__nmemb,0xc0);
  }
  result->references = pUVar9;
  sVar18 = 0;
  if (pUVar9 == (UA_ReferenceDescription *)0x0) {
    uVar7 = 0x80030000;
    local_50 = 0;
  }
  else {
    if (pUVar14->referencesSize == 0) {
      local_44 = 0;
      local_50 = 0;
    }
    else {
      local_44 = 0;
      local_50 = 0;
      if (__nmemb != 0) {
        local_50 = 0;
        local_44 = 0;
        local_60 = 0;
        sVar18 = 0;
        do {
          pUVar16 = (UA_NodeId *)relevant_refs_size;
          sVar3 = local_78;
          local_58 = pUVar14->references + sVar18;
          if (pUVar14->references[sVar18].isInverse == true) {
            if (pUVar13->browseDirection == UA_BROWSEDIRECTION_FORWARD) goto LAB_00122995;
LAB_001228e4:
            if (local_31 == '\0') {
              bVar19 = local_78 != 0;
              pUVar13 = local_40;
              if (bVar19) {
                UVar4 = UA_NodeId_equal(&local_58->referenceTypeId,(UA_NodeId *)relevant_refs_size);
                if (!UVar4) {
                  uVar17 = 0;
                  do {
                    pUVar16 = pUVar16 + 1;
                    pUVar13 = local_40;
                    if (sVar3 - 1 == uVar17) goto LAB_00122995;
                    UVar4 = UA_NodeId_equal(&local_58->referenceTypeId,pUVar16);
                    uVar17 = uVar17 + 1;
                  } while (!UVar4);
                  bVar19 = uVar17 < sVar3;
                }
                pUVar13 = local_40;
                if (bVar19) goto LAB_001228ea;
              }
              goto LAB_00122995;
            }
LAB_001228ea:
            ppUVar8 = findNode(server->nodestore,&(local_58->targetId).nodeId);
            if (ppUVar8 == (UA_NodeStoreEntry **)0x0) {
              src = (UA_Node *)0x0;
            }
            else {
              src = &(*ppUVar8)->node;
            }
            if (((src != (UA_Node *)0x0) && (pUVar13->nodeClassMask != UA_NODECLASS_UNSPECIFIED)) &&
               ((src->nodeClass & pUVar13->nodeClassMask) == UA_NODECLASS_UNSPECIFIED)) {
              src = (UA_Node *)0x0;
            }
          }
          else {
            if (pUVar13->browseDirection != UA_BROWSEDIRECTION_INVERSE) goto LAB_001228e4;
LAB_00122995:
            src = (UA_Node *)0x0;
          }
          sVar3 = local_50;
          if (src != (UA_Node *)0x0) {
            if (local_60 < local_90) {
              local_60 = local_60 + 1;
            }
            else {
              uVar7 = pUVar13->resultMask;
              pUVar1 = result->references;
              pUVar9 = pUVar1 + local_50;
              memset(pUVar9,0,0xc0);
              UVar5 = UA_copy(src,&pUVar1[sVar3].nodeId,UA_TYPES + 0x10);
              if ((uVar7 & 1) != 0) {
                UVar6 = UA_copy(local_58,pUVar9,UA_TYPES + 0x10);
                UVar5 = UVar5 | UVar6;
              }
              if ((uVar7 & 2) != 0) {
                pUVar9->isForward = (UA_Boolean)(local_58->isInverse ^ 1);
              }
              if ((uVar7 & 4) != 0) {
                pUVar9->nodeClass = src->nodeClass;
              }
              if ((uVar7 & 8) != 0) {
                UVar6 = UA_copy(&src->browseName,&pUVar9->browseName,UA_TYPES + 0x13);
                UVar5 = UVar5 | UVar6;
              }
              if ((uVar7 & 0x10) != 0) {
                UVar6 = UA_copy(&src->displayName,&pUVar9->displayName,UA_TYPES + 0x14);
                UVar5 = UVar5 | UVar6;
              }
              local_58 = (UA_ReferenceNode *)CONCAT44(local_58._4_4_,UVar5);
              if ((((uVar7 & 0x20) != 0) && (src->nodeClass - UA_NODECLASS_OBJECT < 2)) &&
                 (src->referencesSize != 0)) {
                lVar12 = 0x20;
                uVar17 = 0;
                do {
                  if (*(int *)((long)src->references + lVar12 + -0x18) == 0x28) {
                    UVar5 = UA_copy((void *)((long)&(src->references->referenceTypeId).
                                                    namespaceIndex + lVar12),&pUVar9->typeDefinition
                                    ,UA_TYPES + 0x11);
                    local_58 = (UA_ReferenceNode *)CONCAT44(local_58._4_4_,(uint)local_58 | UVar5);
                    break;
                  }
                  uVar17 = uVar17 + 1;
                  lVar12 = lVar12 + 0x50;
                } while (uVar17 < src->referencesSize);
              }
              local_44 = local_44 | (uint)local_58;
              local_50 = local_50 + 1;
              pUVar13 = local_40;
            }
          }
          sVar18 = sVar18 + 1;
        } while ((sVar18 < pUVar14->referencesSize) && (local_50 < __nmemb));
      }
    }
    result->referencesSize = local_50;
    if (local_50 == 0) {
      free(result->references);
      result->referencesSize = 0;
      result->references = (UA_ReferenceDescription *)0x0;
    }
    pUVar13 = local_40;
    if (local_44 == 0) goto LAB_00122bb3;
    UA_Array_delete(result->references,result->referencesSize,UA_TYPES + 0x76);
    result->referencesSize = 0;
    result->references = (UA_ReferenceDescription *)0x0;
    pUVar13 = local_40;
    uVar7 = local_44;
  }
  result->statusCode = uVar7;
LAB_00122bb3:
  if ((local_31 == '\0') && (pUVar13->includeSubtypes == true)) {
    UA_Array_delete((void *)relevant_refs_size,local_78,UA_TYPES + 0x10);
  }
  if (result->statusCode != 0) {
    return;
  }
  if (cp != (ContinuationPointEntry *)0x0) {
    if (sVar18 == pUVar14->referencesSize) {
      removeCp(cp,session);
      return;
    }
    cp->continuationIndex = cp->continuationIndex + (int)local_50;
    UA_copy(&cp->identifier,&result->continuationPoint,UA_TYPES + 0xe);
    return;
  }
  if (local_50 < uVar15 || relevant_refs._4_4_ == 0) {
    return;
  }
  if ((session->availableContinuationPoints != 0) &&
     (pCVar10 = (ContinuationPointEntry *)malloc(0x70), pCVar10 != (ContinuationPointEntry *)0x0)) {
    UA_copy(local_40,&pCVar10->browseDescription,UA_TYPES + 0x6c);
    pCVar10->maxReferences = relevant_refs._4_4_;
    pCVar10->continuationIndex = (UA_UInt32)local_50;
    pUVar11 = (UA_Guid *)calloc(1,0x10);
    UVar20 = UA_Guid_random();
    *pUVar11 = UVar20;
    (pCVar10->identifier).data = (UA_Byte *)pUVar11;
    (pCVar10->identifier).length = 0x10;
    UA_copy(&pCVar10->identifier,&result->continuationPoint,UA_TYPES + 0xe);
    pCVar2 = (session->continuationPoints).lh_first;
    (pCVar10->pointers).le_next = pCVar2;
    if (pCVar2 != (ContinuationPointEntry *)0x0) {
      (pCVar2->pointers).le_prev = (ContinuationPointEntry **)pCVar10;
    }
    (session->continuationPoints).lh_first = pCVar10;
    (pCVar10->pointers).le_prev = &(session->continuationPoints).lh_first;
    session->availableContinuationPoints = session->availableContinuationPoints - 1;
    return;
  }
  result->statusCode = 0x804b0000;
  return;
}

Assistant:

void
Service_Browse_single(UA_Server *server, UA_Session *session,
                      struct ContinuationPointEntry *cp, const UA_BrowseDescription *descr,
                      UA_UInt32 maxrefs, UA_BrowseResult *result) { 
    size_t referencesCount = 0;
    size_t referencesIndex = 0;
    /* set the browsedescription if a cp is given */
    UA_UInt32 continuationIndex = 0;
    if(cp) {
        descr = &cp->browseDescription;
        maxrefs = cp->maxReferences;
        continuationIndex = cp->continuationIndex;
    }

    /* is the browsedirection valid? */
    if(descr->browseDirection != UA_BROWSEDIRECTION_BOTH &&
       descr->browseDirection != UA_BROWSEDIRECTION_FORWARD &&
       descr->browseDirection != UA_BROWSEDIRECTION_INVERSE) {
        result->statusCode = UA_STATUSCODE_BADBROWSEDIRECTIONINVALID;
        return;
    }
    
    /* get the references that match the browsedescription */
    size_t relevant_refs_size = 0;
    UA_NodeId *relevant_refs = NULL;
    UA_Boolean all_refs = UA_NodeId_isNull(&descr->referenceTypeId);
    if(!all_refs) {
        const UA_Node *rootRef = UA_NodeStore_get(server->nodestore, &descr->referenceTypeId);
        if(!rootRef || rootRef->nodeClass != UA_NODECLASS_REFERENCETYPE) {
            result->statusCode = UA_STATUSCODE_BADREFERENCETYPEIDINVALID;
            return;
        }
        if(descr->includeSubtypes) {
            result->statusCode = getTypeHierarchy(server->nodestore, rootRef, false,
                                                  &relevant_refs, &relevant_refs_size);
            if(result->statusCode != UA_STATUSCODE_GOOD)
                return;
        } else {
            relevant_refs = (UA_NodeId*)(uintptr_t)&descr->referenceTypeId;
            relevant_refs_size = 1;
        }
    }

    /* get the node */
    const UA_Node *node = UA_NodeStore_get(server->nodestore, &descr->nodeId);
    if(!node) {
        result->statusCode = UA_STATUSCODE_BADNODEIDUNKNOWN;
        if(!all_refs && descr->includeSubtypes)
            UA_Array_delete(relevant_refs, relevant_refs_size, &UA_TYPES[UA_TYPES_NODEID]);
        return;
    }

    /* if the node has no references, just return */
    if(node->referencesSize == 0) {
        result->referencesSize = 0;
        if(!all_refs && descr->includeSubtypes)
            UA_Array_delete(relevant_refs, relevant_refs_size, &UA_TYPES[UA_TYPES_NODEID]);
        return;
    }

    /* how many references can we return at most? */
    size_t real_maxrefs = maxrefs;
    if(real_maxrefs == 0)
        real_maxrefs = node->referencesSize;
    else if(real_maxrefs > node->referencesSize)
        real_maxrefs = node->referencesSize;
    result->references = UA_Array_new(real_maxrefs, &UA_TYPES[UA_TYPES_REFERENCEDESCRIPTION]);
    if(!result->references) {
        result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
        goto cleanup;
    }

    /* loop over the node's references */
    size_t skipped = 0;
    UA_Boolean isExternal = false;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    for(; referencesIndex < node->referencesSize && referencesCount < real_maxrefs; ++referencesIndex) {
        isExternal = false;
        const UA_Node *current =
            returnRelevantNode(server, descr, all_refs, &node->references[referencesIndex],
                               relevant_refs, relevant_refs_size, &isExternal);
        if(!current)
            continue;

        if(skipped < continuationIndex) {
            ++skipped;
        } else {
            retval |= fillReferenceDescription(server->nodestore, current,
                                               &node->references[referencesIndex],
                                               descr->resultMask,
                                               &result->references[referencesCount]);
            ++referencesCount;
        }
    }
    result->referencesSize = referencesCount;

    if(referencesCount == 0) {
        UA_free(result->references);
        result->references = NULL;
        result->referencesSize = 0;
    }

    if(retval != UA_STATUSCODE_GOOD) {
        UA_Array_delete(result->references, result->referencesSize,
                        &UA_TYPES[UA_TYPES_REFERENCEDESCRIPTION]);
        result->references = NULL;
        result->referencesSize = 0;
        result->statusCode = retval;
    }

 cleanup:
    if(!all_refs && descr->includeSubtypes)
        UA_Array_delete(relevant_refs, relevant_refs_size, &UA_TYPES[UA_TYPES_NODEID]);
    if(result->statusCode != UA_STATUSCODE_GOOD)
        return;

    /* create, update, delete continuation points */
    if(cp) {
        if(referencesIndex == node->referencesSize) {
            /* all done, remove a finished continuationPoint */
            removeCp(cp, session);
        } else {
            /* update the cp and return the cp identifier */
            cp->continuationIndex += (UA_UInt32)referencesCount;
            UA_ByteString_copy(&cp->identifier, &result->continuationPoint);
        }
    } else if(maxrefs != 0 && referencesCount >= maxrefs) {
        /* create a cp */
        if(session->availableContinuationPoints <= 0 ||
           !(cp = UA_malloc(sizeof(struct ContinuationPointEntry)))) {
            result->statusCode = UA_STATUSCODE_BADNOCONTINUATIONPOINTS;
            return;
        }
        UA_BrowseDescription_copy(descr, &cp->browseDescription);
        cp->maxReferences = maxrefs;
        cp->continuationIndex = (UA_UInt32)referencesCount;
        UA_Guid *ident = UA_Guid_new();
        *ident = UA_Guid_random();
        cp->identifier.data = (UA_Byte*)ident;
        cp->identifier.length = sizeof(UA_Guid);
        UA_ByteString_copy(&cp->identifier, &result->continuationPoint);

        /* store the cp */
        LIST_INSERT_HEAD(&session->continuationPoints, cp, pointers);
        --session->availableContinuationPoints;
    }
}